

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O2

void __thiscall tf::Executor::~Executor(Executor *this)

{
  pointer pWVar1;
  long lVar2;
  ulong uVar3;
  vector<tf::Worker,_std::allocator<tf::Worker>_> *__range1;
  pointer pWVar4;
  
  wait_for_all(this);
  lVar2 = 0;
  for (uVar3 = 0;
      pWVar4 = (this->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(this->_workers).
                             super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pWVar4) / 0x980);
      uVar3 = uVar3 + 1) {
    (&pWVar4->_done)[lVar2]._M_base._M_i = true;
    lVar2 = lVar2 + 0x980;
  }
  NonblockingNotifierV2::_notify<true>(&this->_notifier);
  pWVar1 = (this->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pWVar4 = (this->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl
                .super__Vector_impl_data._M_start; pWVar4 != pWVar1; pWVar4 = pWVar4 + 1) {
    std::thread::join();
  }
  std::
  _Hashtable<std::shared_ptr<tf::ObserverInterface>,_std::shared_ptr<tf::ObserverInterface>,_std::allocator<std::shared_ptr<tf::ObserverInterface>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<tf::ObserverInterface>_>,_std::hash<std::shared_ptr<tf::ObserverInterface>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->_observers)._M_h);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_worker_interface).
              super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>::
  ~vector(&(this->_buffers)._buckets);
  std::__cxx11::_List_base<tf::Taskflow,_std::allocator<tf::Taskflow>_>::_M_clear
            (&(this->_taskflows).super__List_base<tf::Taskflow,_std::allocator<tf::Taskflow>_>);
  std::condition_variable::~condition_variable(&this->_topology_cv);
  std::vector<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
  ::~vector(&(this->_notifier)._waiters);
  std::vector<tf::Worker,_std::allocator<tf::Worker>_>::~vector(&this->_workers);
  return;
}

Assistant:

inline Executor::~Executor() {

  // wait for all topologies to complete
  wait_for_all();

  // shut down the scheduler
  for(size_t i=0; i<_workers.size(); ++i) {
  #if __cplusplus >= TF_CPP20
    _workers[i]._done.test_and_set(std::memory_order_relaxed);
  #else
    _workers[i]._done.store(true, std::memory_order_relaxed);
  #endif
  }

  _notifier.notify_all();

  for(auto& w : _workers) {
    w._thread.join();
  }
}